

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void RAWToRGB24Row_C(uint8 *src_raw,uint8 *dst_rgb24,int width)

{
  uint8 uVar1;
  uint8 uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar3 = 0;
  uVar5 = (ulong)(uint)width;
  if (width < 1) {
    uVar5 = uVar3;
  }
  while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
    uVar1 = src_raw[uVar3];
    uVar2 = src_raw[uVar3 + 1];
    dst_rgb24[uVar3] = src_raw[uVar3 + 2];
    dst_rgb24[uVar3 + 1] = uVar2;
    dst_rgb24[uVar3 + 2] = uVar1;
    uVar3 = uVar3 + 3;
  }
  return;
}

Assistant:

void RAWToRGB24Row_C(const uint8* src_raw, uint8* dst_rgb24, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8 r = src_raw[0];
    uint8 g = src_raw[1];
    uint8 b = src_raw[2];
    dst_rgb24[0] = b;
    dst_rgb24[1] = g;
    dst_rgb24[2] = r;
    dst_rgb24 += 3;
    src_raw += 3;
  }
}